

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void if_expr(Vm *vm)

{
  uint64_t offset;
  uint64_t offset_00;
  
  advance(vm);
  expr(vm);
  offset = emit_jump(vm,OP_JMF);
  block_expr(vm);
  offset_00 = emit_jump(vm,OP_JMP);
  patch_jump(vm,offset);
  if ((vm->compiler).token.type == TOKEN_ELSE) {
    advance(vm);
    if ((vm->compiler).token.type == TOKEN_IF) {
      if_expr(vm);
    }
    else {
      block_expr(vm);
    }
  }
  else {
    emit_no_arg(vm,OP_NIL);
  }
  patch_jump(vm,offset_00);
  return;
}

Assistant:

static void if_expr(Vm *vm) {
    advance(vm);
    expr(vm);

    uint64_t false_jump = emit_jump(vm, OP_JMF);
    block_expr(vm);

    uint64_t exit_jump = emit_jump(vm, OP_JMP);
    patch_jump(vm, false_jump);

    if (vm->compiler.token.type == TOKEN_ELSE) {
        advance(vm);
        if (vm->compiler.token.type == TOKEN_IF) {
            if_expr(vm);
        } else {
            block_expr(vm);
        }
    } else {
        emit_no_arg(vm, OP_NIL);
    }
    patch_jump(vm, exit_jump);
}